

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::exception::eval_error::format_types_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,Const_Proxy_Function *t_func,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Dynamic_Proxy_Function *this_02;
  Dynamic_Proxy_Function *this_03;
  AST_Node *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined7 in_register_00000009;
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  char *__s;
  long lVar7;
  string paramstr;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  stringstream ss;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_1d8;
  eval_error *local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  lVar6 = *(long *)this;
  if (lVar6 == 0) {
    __assert_fail("t_func",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_common.hpp"
                  ,0x18a,
                  "static std::string chaiscript::exception::eval_error::format_types(const Const_Proxy_Function &, bool, const chaiscript::detail::Dispatch_Engine &)"
                 );
  }
  iVar1 = *(int *)(lVar6 + 0x20);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_1d8,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)(lVar6 + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 == -1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,0,"(...)",5);
    if ((char)t_func != '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "(Object).",__return_storage_ptr__);
      format_types_abi_cxx11_();
    }
  }
  else if ((ulong)(((long)local_1d8.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1d8.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2
          ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (__return_storage_ptr__,0,0,"()",2);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"(",1);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_allocated_capacity =
         local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __n = 0xfffffffffffffffe;
    if ((long)local_1d8.
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1d8.
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x18) {
      lVar6 = 1;
      lVar7 = 0x18;
      local_1c0 = this;
      do {
        __s = "";
        if ((*(byte *)((long)&(local_1d8.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_flags + lVar7) & 1) !=
            0) {
          __s = "const ";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1f8,__s);
        detail::Dispatch_Engine::get_type_name_abi_cxx11_
                  (&local_218,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                   (Type_Info *)
                   ((long)&(local_1d8.
                            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar7));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_1f8,local_218._M_dataplus._M_p,local_218._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (lVar6 == 1 && (char)t_func == '\x01') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_1f8,").(");
          if ((long)local_1d8.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x30) goto LAB_0032ce48;
        }
        else {
LAB_0032ce48:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_1f8,", ");
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar6 != ((long)local_1d8.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1d8.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
      __n = local_1f8._M_string_length - 2;
      this = local_1c0;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_218,&local_1f8,0,__n);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),local_218._M_dataplus._M_p,local_218._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (*(long *)this != 0) {
    this_02 = (Dynamic_Proxy_Function *)
              __dynamic_cast(*(long *)this,&dispatch::Proxy_Function_Base::typeinfo,
                             &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    if (this_02 != (Dynamic_Proxy_Function *)0x0) {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if ((this_02->m_parsenode).
          super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        peVar2 = (this_02->m_guard).
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        this_01 = (this_02->m_guard).
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        if (peVar2 != (element_type *)0x0) {
          this_03 = (Dynamic_Proxy_Function *)
                    __dynamic_cast(peVar2,&dispatch::Proxy_Function_Base::typeinfo,
                                   &dispatch::Dynamic_Proxy_Function::typeinfo,0);
          if (this_03 != (Dynamic_Proxy_Function *)0x0) {
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_01->_M_use_count = this_01->_M_use_count + 1;
              }
            }
            if ((this_03->m_parsenode).
                super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              pAVar3 = dispatch::Dynamic_Proxy_Function::get_parse_tree(this_03);
              AST_Node::pretty_print_abi_cxx11_(&local_218,pAVar3);
              pbVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_218,0,0," : ",3);
              local_1f8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
              paVar5 = &pbVar4->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p == paVar5) {
                local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
              }
              local_1f8._M_string_length = pbVar4->_M_string_length;
              (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
              pbVar4->_M_string_length = 0;
              (pbVar4->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(__return_storage_ptr__,local_1f8._M_dataplus._M_p,local_1f8._M_string_length
                       );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
            }
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
          }
        }
        pAVar3 = dispatch::Dynamic_Proxy_Function::get_parse_tree(this_02);
        format_location<chaiscript::AST_Node>(&local_218,pAVar3);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_218,0,0,"\n          Defined at ",0x16);
        local_1f8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p == paVar5) {
          local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        }
        else {
          local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_1f8._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  if (local_1d8.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        assert(t_func);
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1) {
          retval = "(...)";
          if (t_dot_notation) {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1; index != types.size(); ++index) {
            paramstr += (types[index].is_const() ? "const " : "");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation) {
              paramstr += ").(";
              if (types.size() == 2) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }

        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun
            = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun && dynfun->has_parse_tree()) {
          Proxy_Function f = dynfun->get_guard();

          if (f) {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard && dynfunguard->has_parse_tree()) {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());
        }

        return retval;
      }